

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O1

void SplitPath(tchar_t *URL,tchar_t *Dir,int DirLen,tchar_t *Name,int NameLen,tchar_t *Ext,
              int ExtLen)

{
  int iVar1;
  tchar_t *__s;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  tchar_t *Out;
  bool_t HasHost;
  tchar_t Protocol [256];
  tchar_t LocalURL [256];
  long local_240;
  tchar_t local_238 [256];
  tchar_t local_138 [264];
  
  __s = GetProtocol(URL,local_238,0x100,&local_240);
  pcVar2 = strrchr(__s,0x5c);
  pcVar3 = strrchr(__s,0x2f);
  pcVar5 = pcVar2;
  if (pcVar2 < pcVar3) {
    pcVar5 = pcVar3;
  }
  if (pcVar2 == (char *)0x0) {
    pcVar5 = pcVar3;
  }
  if (pcVar5 == (char *)0x0) {
    if (local_240 == 0) {
      if (Dir != (tchar_t *)0x0) {
        tcsncpy_s(Dir,(long)DirLen,URL,(long)__s - (long)URL);
      }
    }
    else {
      if (Dir != (tchar_t *)0x0) {
        tcscpy_s(Dir,(long)DirLen,URL);
      }
      sVar4 = strlen(URL);
      __s = URL + sVar4;
    }
  }
  else {
    if (Dir != (tchar_t *)0x0) {
      tcsncpy_s(Dir,(long)DirLen,URL,(long)pcVar5 - (long)URL);
    }
    __s = pcVar5 + 1;
  }
  iVar1 = tcsicmp(local_238,"http");
  Out = __s;
  if ((iVar1 == 0) && (pcVar5 = strrchr(__s,0x23), pcVar5 != (char *)0x0)) {
    Out = local_138;
    tcscpy_s(Out,0x100,__s);
    pcVar5 = strrchr(Out,0x23);
    *pcVar5 = '\0';
  }
  if (Name != Ext || Name == (tchar_t *)0x0) {
    pcVar5 = strrchr(Out,0x2e);
    if (pcVar5 == (char *)0x0) {
      if (Name != (tchar_t *)0x0) {
        tcscpy_s(Name,(long)NameLen,Out);
      }
      if (Ext == (tchar_t *)0x0) {
        return;
      }
      *Ext = '\0';
      return;
    }
    if (Name != (tchar_t *)0x0) {
      tcsncpy_s(Name,(long)NameLen,Out,(long)pcVar5 - (long)Out);
    }
    if (Ext == (tchar_t *)0x0) {
      return;
    }
    Out = pcVar5 + 1;
    Name = Ext;
    NameLen = ExtLen;
    if (pcVar5[1] == '\0') {
      Out = pcVar5;
    }
  }
  tcscpy_s(Name,(long)NameLen,Out);
  return;
}

Assistant:

void SplitPath(const tchar_t* URL, tchar_t* Dir, int DirLen, tchar_t* Name, int NameLen, tchar_t* Ext, int ExtLen)
{
    const tchar_t *p,*p2,*p3;
    bool_t HasHost;
    tchar_t LocalURL[MAXPATH];
    tchar_t Protocol[MAXPATH];

    // mime
    p = GetProtocol(URL,Protocol,TSIZEOF(Protocol),&HasHost);

    // dir
    p2 = tcsrchr(p,'\\');
    p3 = tcsrchr(p,'/');
    if (!p2 || (p3 && p3>p2))
        p2 = p3;

    if (p2)
    {
        if (Dir)
            tcsncpy_s(Dir,DirLen,URL,p2-URL);
        URL = p2+1;
    }
    else
    if (HasHost) // no filename, only host
    {
        if (Dir)
            tcscpy_s(Dir,DirLen,URL);
        URL += tcslen(URL);
    }
    else // no directory
    {
        if (Dir)
            tcsncpy_s(Dir,DirLen,URL,p-URL);
        URL = p;
    }

    // name
    if (tcsicmp(Protocol,T("http"))==0 && tcsrchr(URL,T('#')))
    {
        tchar_t *NulChar;
        tcscpy_s(LocalURL,TSIZEOF(LocalURL),URL);
        URL = LocalURL;
        NulChar = tcsrchr(LocalURL,T('#'));
        *NulChar = 0;
    }

    if (Name && Name == Ext)
        tcscpy_s(Name,NameLen,URL);
    else
    {
        p = tcsrchr(URL,'.');
        if (p)
        {
            if (Name)
                tcsncpy_s(Name,NameLen,URL,p-URL);
            if (Ext)
            {
                if (p[1]) ++p; // remove '.', but only if there is a real extension
                tcscpy_s(Ext,ExtLen,p);
            }
        }
        else
        {
            if (Name)
                tcscpy_s(Name,NameLen,URL);
            if (Ext)
                Ext[0] = 0;
        }
    }
}